

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool generate_starburst_room
                (chunk_conflict *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,_Bool light,
                wchar_t feat,_Bool special_ok)

{
  wchar_t wVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  int x_00;
  int iVar8;
  wchar_t wVar9;
  loc_conflict lVar10;
  monster *pmVar11;
  object *poVar12;
  loc grid1_00;
  square_conflict *psVar13;
  loc_conflict grid_00;
  int local_2cc;
  loc grid1;
  loc grid_1;
  loc grid;
  wchar_t tmp_cx2;
  wchar_t tmp_cy2;
  wchar_t tmp_cx1;
  wchar_t tmp_cy1;
  wchar_t local_20c;
  wchar_t local_208;
  wchar_t tmp_bx;
  wchar_t tmp_by;
  wchar_t tmp_ax;
  wchar_t tmp_ay;
  wchar_t local_1ec;
  wchar_t wStack_1e8;
  wchar_t arc_num;
  wchar_t arc [45] [2];
  _Bool make_cloverleaf;
  wchar_t degree;
  wchar_t center_of_arc;
  wchar_t degree_first;
  wchar_t width;
  wchar_t height;
  wchar_t dist_check;
  wchar_t dist_conv;
  wchar_t max_dist;
  wchar_t dist;
  wchar_t d;
  wchar_t i;
  wchar_t nx;
  wchar_t ny;
  wchar_t x;
  wchar_t y;
  wchar_t x0;
  wchar_t y0;
  _Bool special_ok_local;
  _Bool light_local;
  wchar_t x2_local;
  wchar_t y2_local;
  wchar_t x1_local;
  wchar_t y1_local;
  chunk_conflict *c_local;
  
  bVar2 = false;
  lVar10 = (loc_conflict)loc(x1,y1);
  _Var3 = square_in_bounds((chunk *)c,lVar10);
  if (_Var3) {
    lVar10 = (loc_conflict)loc(x2,y2);
    _Var3 = square_in_bounds((chunk *)c,lVar10);
    if (_Var3) {
      if ((y2 <= y1 + L'\x02') || (x2 <= x1 + L'\x02')) {
        return false;
      }
      iVar4 = (y2 + L'\x01') - y1;
      iVar5 = (x2 + L'\x01') - x1;
      if (((iVar5 * 5) / 2 < iVar4) || ((iVar4 * 5) / 2 < iVar5)) {
        if (iVar5 < iVar4) {
          tmp_by = y1 + (iVar4 * 2) / 3;
          tmp_bx = x2;
        }
        else {
          tmp_bx = x1 + (iVar5 * 2) / 3;
          tmp_by = y2;
        }
        generate_starburst_room(c,y1,x1,tmp_by,tmp_bx,light,feat,false);
        if (iVar5 < iVar4) {
          local_208 = y1 + iVar4 / 3;
          local_20c = x1;
        }
        else {
          local_20c = x1 + iVar5 / 3;
          local_208 = y1;
        }
        generate_starburst_room(c,local_208,local_20c,y2,x2,light,feat,false);
        _Var3 = feat_is_floor(feat);
        if (_Var3) {
          for (ny = (y1 + tmp_by) / 2; ny <= (local_208 + y2) / 2; ny = ny + L'\x01') {
            for (nx = (x1 + tmp_bx) / 2; nx <= (local_20c + x2) / 2; nx = nx + L'\x01') {
              lVar10 = (loc_conflict)loc(nx,ny);
              square_set_feat((chunk *)c,lVar10,feat);
            }
          }
        }
        else {
          if (iVar5 < iVar4) {
            tmp_cy2 = y1 + (iVar4 - iVar5) / 2;
            grid.y = tmp_cy2 - (iVar4 - iVar5) / 2;
            grid.x = x2;
            tmp_cx2 = x1;
          }
          else {
            tmp_cx2 = x1 + (iVar5 - iVar4) / 2;
            grid.x = tmp_cx2 + (iVar5 - iVar4) / 2;
            grid.y = y2;
            tmp_cy2 = y1;
          }
          generate_starburst_room(c,tmp_cy2,tmp_cx2,grid.y,grid.x,light,feat,false);
        }
        return true;
      }
      if ((iVar5 < 0x2d) && (iVar4 < 0x2d)) {
        height = L'\n';
      }
      else {
        iVar7 = iVar4;
        if (iVar4 < iVar5) {
          iVar7 = iVar5;
        }
        height = (iVar7 * 10) / 0x2c;
      }
      if (((special_ok) && (10 < iVar4)) && (uVar6 = Rand_div(0x14), uVar6 == 0)) {
        local_1ec = L'\f';
        bVar2 = true;
      }
      else {
        uVar6 = Rand_div(7);
        local_1ec = ((iVar4 * iVar5) / 0x50 + 0xb) - uVar6;
        if (local_1ec < L'\b') {
          local_1ec = L'\b';
        }
        if (L'-' < local_1ec) {
          local_1ec = L'-';
        }
      }
      iVar7 = y1 + iVar4 / 2;
      x_00 = x1 + iVar5 / 2;
      degree = L'\0';
      for (dist = L'\0'; dist < local_1ec; dist = dist + L'\x01') {
        (&wStack_1e8)[(long)dist * 2] = degree;
        uVar6 = Rand_div(local_1ec);
        degree = (int)(uVar6 + 0xb4) / local_1ec + degree;
        if (degree < ((dist + L'\x01') * 0xb4) / local_1ec) {
          degree = ((dist + L'\x01') * 0xb4) / local_1ec;
        }
        if (((local_1ec + L'´') * (dist + L'\x01')) / local_1ec < degree) {
          degree = ((local_1ec + L'´') * (dist + L'\x01')) / local_1ec;
        }
        iVar8 = degree + (&wStack_1e8)[(long)dist * 2];
        if (((iVar8 < 0x2e) || (0x86 < iVar8)) && ((iVar8 < 0xe2 || (0x13a < iVar8)))) {
          if (((iVar8 < 0x2d) || (0x13b < iVar8)) || ((iVar8 < 0xe1 && (0x87 < iVar8)))) {
            uVar6 = Rand_div((iVar5 + 3) / 4);
            arc[(long)dist + -1][1] = iVar5 / 4 + uVar6;
          }
          else if (dist != L'\0') {
            if (bVar2) {
              arc[(long)dist + -1][1] = L'\0';
            }
            else {
              wVar9 = arc[(long)(dist + L'\xffffffff') + -1][1];
              uVar6 = Rand_div(7);
              arc[(long)dist + -1][1] = (wVar9 + L'\x03') - uVar6;
            }
          }
        }
        else {
          uVar6 = Rand_div((iVar4 + 3) / 4);
          arc[(long)dist + -1][1] = iVar4 / 4 + uVar6;
        }
        if (((!bVar2) && (dist != L'\0')) && (dist != local_1ec + L'\xffffffff')) {
          _Var3 = feat_is_smooth(feat);
          if (_Var3) {
            if (arc[(long)(dist + L'\xffffffff') + -1][1] + L'\x02' < arc[(long)dist + -1][1]) {
              arc[(long)dist + -1][1] = arc[(long)(dist + L'\xffffffff') + -1][1] + L'\x02';
            }
            if (arc[(long)(dist + L'\xffffffff') + -1][1] + L'\xfffffffe' < arc[(long)dist + -1][1])
            {
              arc[(long)dist + -1][1] = arc[(long)(dist + L'\xffffffff') + -1][1] + L'\xfffffffe';
            }
          }
          else {
            if (((arc[(long)(dist + L'\xffffffff') + -1][1] + L'\x01') * 3) / 2 <
                arc[(long)dist + -1][1]) {
              arc[(long)dist + -1][1] =
                   ((arc[(long)(dist + L'\xffffffff') + -1][1] + L'\x01') * 3) / 2;
            }
            if (arc[(long)dist + -1][1] <
                ((arc[(long)(dist + L'\xffffffff') + -1][1] + L'\xffffffff') * 2) / 3) {
              arc[(long)dist + -1][1] =
                   ((arc[(long)(dist + L'\xffffffff') + -1][1] + L'\xffffffff') * 2) / 3;
            }
          }
        }
        if (dist == local_1ec + L'\xffffffff') {
          if (arc[(long)dist + -1][1] - arc_num < 0) {
            local_2cc = -(arc[(long)dist + -1][1] - arc_num);
          }
          else {
            local_2cc = arc[(long)dist + -1][1] - arc_num;
          }
          if (3 < local_2cc) {
            if (arc_num < arc[(long)dist + -1][1]) {
              uVar6 = Rand_div(arc[(long)dist + -1][1] - arc_num);
              arc[(long)dist + -1][1] = arc[(long)dist + -1][1] - uVar6;
            }
            else if (arc[(long)dist + -1][1] < arc_num) {
              uVar6 = Rand_div(arc_num - arc[(long)dist + -1][1]);
              arc[(long)dist + -1][1] = uVar6 + arc[(long)dist + -1][1];
            }
          }
        }
      }
      ny = y1 + L'\x01';
      do {
        if (y2 <= ny) {
          _Var3 = feat_is_floor(feat);
          if ((_Var3) || (feat == L'\x15')) {
            for (ny = y1 + L'\x01'; ny < y2; ny = ny + L'\x01') {
              for (nx = x1 + L'\x01'; nx < x2; nx = nx + L'\x01') {
                lVar10 = (loc_conflict)loc(nx,ny);
                _Var3 = square_isfloor((chunk *)c,lVar10);
                if (_Var3) {
                  for (max_dist = L'\0'; max_dist < L'\b'; max_dist = max_dist + L'\x01') {
                    grid_00 = (loc_conflict)loc_sum((loc)lVar10,ddgrid_ddd[max_dist]);
                    psVar13 = square((chunk *)c,grid_00);
                    flag_on_dbg(psVar13->info,3,4,"square(c, grid1)->info","SQUARE_ROOM");
                    psVar13 = square((chunk *)c,grid_00);
                    flag_on_dbg(psVar13->info,3,0x14,"square(c, grid1)->info","SQUARE_NO_STAIRS");
                    if (light) {
                      psVar13 = square((chunk *)c,grid_00);
                      flag_on_dbg(psVar13->info,3,2,"square(c, grid1)->info","SQUARE_GLOW");
                    }
                    psVar13 = square((chunk *)c,grid_00);
                    if (psVar13->feat == '\x15') {
                      set_marked_granite(c,(loc)grid_00,L'\f');
                    }
                  }
                }
              }
            }
          }
          return true;
        }
        for (nx = x1 + L'\x01'; nx < x2; nx = nx + L'\x01') {
          lVar10 = (loc_conflict)loc(nx,ny);
          _Var3 = square_isvault((chunk *)c,lVar10);
          if (((!_Var3) && (pmVar11 = square_monster((chunk *)c,lVar10), pmVar11 == (monster *)0x0))
             && (poVar12 = square_object((chunk *)c,lVar10), poVar12 == (object *)0x0)) {
            grid1_00 = loc(x_00,iVar7);
            wVar9 = distance(grid1_00,(loc)lVar10);
            if (wVar9 < (height * 0x15) / 10) {
              iVar4 = ((ny - iVar7) * 10) / height + 0x14;
              iVar5 = ((nx - x_00) * 10) / height + 0x14;
              if (((-1 < iVar4) && (iVar4 < 0x29)) && ((-1 < iVar5 && (iVar5 < 0x29)))) {
                dist = local_1ec;
                do {
                  dist = dist + L'\xffffffff';
                  if (dist < L'\0') goto LAB_001691a4;
                } while ((int)(uint)get_angle_to_grid[iVar4][iVar5] < (&wStack_1e8)[(long)dist * 2])
                ;
                wVar1 = arc[(long)dist + -1][1];
                if (wVar9 <= wVar1) {
                  _Var3 = feat_is_floor(feat);
                  if ((_Var3) || (_Var3 = feat_is_passable(feat), !_Var3)) {
                    square_set_feat((chunk *)c,lVar10,feat);
                    _Var3 = feat_is_floor(feat);
                    if (_Var3) {
                      psVar13 = square((chunk *)c,lVar10);
                      flag_on_dbg(psVar13->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
                    }
                    else {
                      psVar13 = square((chunk *)c,lVar10);
                      flag_off(psVar13->info,3,4);
                    }
                    if (light) {
                      psVar13 = square((chunk *)c,lVar10);
                      flag_on_dbg(psVar13->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
                    }
                    else {
                      _Var3 = square_isbright((chunk *)c,lVar10);
                      if (!_Var3) {
                        psVar13 = square((chunk *)c,lVar10);
                        flag_off(psVar13->info,3,2);
                      }
                    }
                  }
                  else {
                    _Var3 = feat_is_smooth(feat);
                    if (_Var3) {
                      _Var3 = square_isfloor((chunk *)c,lVar10);
                      if (_Var3) {
                        square_set_feat((chunk *)c,lVar10,feat);
                      }
                    }
                    else {
                      _Var3 = square_isfloor((chunk *)c,lVar10);
                      if ((_Var3) &&
                         (uVar6 = Rand_div(wVar1 + L'\x05'), wVar9 + L'\x05' <= (int)(uVar6 + 1))) {
                        square_set_feat((chunk *)c,lVar10,feat);
                      }
                    }
                    if (light) {
                      psVar13 = square((chunk *)c,lVar10);
                      flag_on_dbg(psVar13->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
                    }
                  }
                }
              }
            }
          }
LAB_001691a4:
        }
        ny = ny + L'\x01';
      } while( true );
    }
  }
  return false;
}

Assistant:

extern bool generate_starburst_room(struct chunk *c, int y1, int x1, int y2, 
									int x2, bool light, int feat, 
									bool special_ok)
{
	int y0, x0, y, x, ny, nx;
	int i, d;
	int dist, max_dist, dist_conv, dist_check;
	int height, width;
	int degree_first, center_of_arc, degree;

	/* Special variant room.  Discovered by accident. */
	bool make_cloverleaf = false;

	/* Holds first degree of arc, maximum effect distance in arc. */
	int arc[45][2];

	/* Number (max 45) of arcs. */
	int arc_num;

	/* Make certain the room does not cross the dungeon edge. */
	if ((!square_in_bounds(c, loc(x1, y1))) ||
		(!square_in_bounds(c, loc(x2, y2))))
		return (false);

	/* Robustness -- test sanity of input coordinates. */
	if ((y1 + 2 >= y2) || (x1 + 2 >= x2))
		return (false);


	/* Get room height and width. */
	height = 1 + y2 - y1;
	width = 1 + x2 - x1;


	/* Handle long, narrow rooms by dividing them up. */
	if ((height > 5 * width / 2) || (width > 5 * height / 2)) {
		int tmp_ay, tmp_ax, tmp_by, tmp_bx;

		/* Get bottom-left borders of the first room. */
		tmp_ay = y2;
		tmp_ax = x2;
		if (height > width)
			tmp_ay = y1 + 2 * height / 3;
		else
			tmp_ax = x1 + 2 * width / 3;

		/* Make the first room. */
		(void) generate_starburst_room(c, y1, x1, tmp_ay, tmp_ax, light, feat,
									   false);


		/* Get top_right borders of the second room. */
		tmp_by = y1;
		tmp_bx = x1;
		if (height > width)
			tmp_by = y1 + 1 * height / 3;
		else
			tmp_bx = x1 + 1 * width / 3;

		/* Make the second room. */
		(void) generate_starburst_room(c, tmp_by, tmp_bx, y2, x2, light, feat,
									   false);


		/* If floor, extend a "corridor" between room centers, to ensure 
		 * that the rooms are connected together. */
		if (feat_is_floor(feat)) {
			for (y = (y1 + tmp_ay) / 2; y <= (tmp_by + y2) / 2; y++) {
				for (x = (x1 + tmp_ax) / 2; x <= (tmp_bx + x2) / 2; x++) {
					square_set_feat(c, loc(x, y), feat);
				}
			}
		} else {
			/* Otherwise fill any gap between two starbursts. */
			int tmp_cy1, tmp_cx1, tmp_cy2, tmp_cx2;

			if (height > width) {
				tmp_cy1 = y1 + (height - width) / 2;
				tmp_cx1 = x1;
				tmp_cy2 = tmp_cy1 - (height - width) / 2;
				tmp_cx2 = x2;
			} else {
				tmp_cy1 = y1;
				tmp_cx1 = x1 + (width - height) / 2;
				tmp_cy2 = y2;
				tmp_cx2 = tmp_cx1 + (width - height) / 2;
			}

			/* Make the third room. */
			(void) generate_starburst_room(c, tmp_cy1, tmp_cx1, tmp_cy2,
										   tmp_cx2, light, feat, false);
		}

		/* Return. */
		return (true);
	}


	/* Get a shrinkage ratio for large rooms, as table is limited. */
	if ((width > 44) || (height > 44)) {
		if (width > height)
			dist_conv = 10 * width / 44;
		else
			dist_conv = 10 * height / 44;
	} else
		dist_conv = 10;


	/* Make a cloverleaf room sometimes. */
	if ((special_ok) && (height > 10) && (randint0(20) == 0)) {
		arc_num = 12;
		make_cloverleaf = true;
	}

	/* Usually, we make a normal starburst. */
	else {
		/* Ask for a reasonable number of arcs. */
		arc_num = 8 + (height * width / 80);
		arc_num = arc_num + 3 - randint0(7);
		if (arc_num < 8)
			arc_num = 8;
		if (arc_num > 45)
			arc_num = 45;
	}


	/* Get the center of the starburst. */
	y0 = y1 + height / 2;
	x0 = x1 + width / 2;

	/* Start out at zero degrees. */
	degree_first = 0;


	/* Determine the start degrees and expansion distance for each arc. */
	for (i = 0; i < arc_num; i++) {
		/* Get the first degree for this arc. */
		arc[i][0] = degree_first;

		/* Get a slightly randomized start degree for the next arc. */
		degree_first += (180 + randint0(arc_num)) / arc_num;
		if (degree_first < 180 * (i + 1) / arc_num)
			degree_first = 180 * (i + 1) / arc_num;
		if (degree_first > (180 + arc_num) * (i + 1) / arc_num)
			degree_first = (180 + arc_num) * (i + 1) / arc_num;


		/* Get the center of the arc. */
		center_of_arc = degree_first + arc[i][0];

		/* Calculate a reasonable distance to expand vertically. */
		if (((center_of_arc > 45) && (center_of_arc < 135))
			|| ((center_of_arc > 225) && (center_of_arc < 315))) {
			arc[i][1] = height / 4 + randint0((height + 3) / 4);
		}

		/* Calculate a reasonable distance to expand horizontally. */
		else if (((center_of_arc < 45) || (center_of_arc > 315))
				 || ((center_of_arc < 225) && (center_of_arc > 135))) {
			arc[i][1] = width / 4 + randint0((width + 3) / 4);
		}

		/* Handle arcs that count as neither vertical nor horizontal */
		else if (i != 0) {
			if (make_cloverleaf)
				arc[i][1] = 0;
			else
				arc[i][1] = arc[i - 1][1] + 3 - randint0(7);
		}


		/* Keep variability under control. */
		if ((!make_cloverleaf) && (i != 0) && (i != arc_num - 1)) {
			/* Water edges must be quite smooth. */
			if (feat_is_smooth(feat)) {
				if (arc[i][1] > arc[i - 1][1] + 2)
					arc[i][1] = arc[i - 1][1] + 2;

				if (arc[i][1] > arc[i - 1][1] - 2)
					arc[i][1] = arc[i - 1][1] - 2;
			} else {
				if (arc[i][1] > 3 * (arc[i - 1][1] + 1) / 2)
					arc[i][1] = 3 * (arc[i - 1][1] + 1) / 2;

				if (arc[i][1] < 2 * (arc[i - 1][1] - 1) / 3)
					arc[i][1] = 2 * (arc[i - 1][1] - 1) / 3;
			}
		}

		/* Neaten up final arc of circle by comparing it to the first. */
		if ((i == arc_num - 1) && (ABS(arc[i][1] - arc[0][1]) > 3)) {
			if (arc[i][1] > arc[0][1])
				arc[i][1] -= randint0(arc[i][1] - arc[0][1]);
			else if (arc[i][1] < arc[0][1])
				arc[i][1] += randint0(arc[0][1] - arc[i][1]);
		}
	}


	/* Precalculate check distance. */
	dist_check = 21 * dist_conv / 10;

	/* Change grids between (and not including) the edges. */
	for (y = y1 + 1; y < y2; y++) {
		for (x = x1 + 1; x < x2; x++) {
			struct loc grid = loc(x, y);

			/* Do not touch vault grids. */
			if (square_isvault(c, grid))
				continue;

			/* Do not touch occupied grids. */
			if (square_monster(c, grid))
				continue;
			if (square_object(c, grid))
				continue;

			/* Get distance to grid. */
			dist = distance(loc(x0, y0), grid);

			/* Reject grid if outside check distance. */
			if (dist >= dist_check) 
				continue;

			/* Convert and reorient grid for table access. */
			ny = 20 + 10 * (y - y0) / dist_conv;
			nx = 20 + 10 * (x - x0) / dist_conv;

			/* Illegal table access is bad. */
			if ((ny < 0) || (ny > 40) || (nx < 0) || (nx > 40))
				continue;

			/* Get angle to current grid. */
			degree = get_angle_to_grid[ny][nx];

			/* Scan arcs to find the one that applies here. */
			for (i = arc_num - 1; i >= 0; i--) {
				if (arc[i][0] <= degree) {
					max_dist = arc[i][1];

					/* Must be within effect range. */
					if (max_dist >= dist) {
						/* If new feature is not passable, or floor, always 
						 * place it. */
						if (feat_is_floor(feat) || !feat_is_passable(feat)) {
							square_set_feat(c, grid, feat);

							if (feat_is_floor(feat)) {
								sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
							} else {
								sqinfo_off(square(c, grid)->info, SQUARE_ROOM);
							}

							if (light) {
								sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
							} else if (!square_isbright(c, grid)) {
								sqinfo_off(square(c, grid)->info, SQUARE_GLOW);
							}
						}

						/* If new feature is non-floor passable terrain,
						 * place it only over floor. */
						else {
							/* Replace old feature entirely in some cases. */
							if (feat_is_smooth(feat)) {
								if (square_isfloor(c, grid))
									square_set_feat(c, grid, feat);
							} else {
								/* Make denser in the middle. */
								if (square_isfloor(c, grid) &&
									(randint1(max_dist + 5) >= dist + 5))
									square_set_feat(c, grid, feat);
							}

							/* Light grid. */
							if (light)
								sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
						}
					}

					/* Arc found.  End search */
					break;
				}
			}
		}
	}

	/*
	 * If we placed floors or dungeon granite, all dungeon granite next
	 * to floors needs to become outer wall.
	 */
	if (feat_is_floor(feat) || feat == FEAT_GRANITE) {
		for (y = y1 + 1; y < y2; y++) {
			for (x = x1 + 1; x < x2; x++) {

				struct loc grid = loc(x, y);
				/* Floor grids only */
				if (square_isfloor(c, grid)) {
					/* Look in all directions. */
					for (d = 0; d < 8; d++) {
						/* Extract adjacent location */
						struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

						/* Join to room, forbid stairs */
						sqinfo_on(square(c, grid1)->info, SQUARE_ROOM);
						sqinfo_on(square(c, grid1)->info, SQUARE_NO_STAIRS);

						/* Illuminate if requested. */
						if (light)
							sqinfo_on(square(c, grid1)->info, SQUARE_GLOW);

						/* Look for dungeon granite. */
						if (square(c, grid1)->feat == FEAT_GRANITE) {
							/* Mark as outer wall. */
							set_marked_granite(c, grid1, SQUARE_WALL_OUTER);
						}
					}
				}
			}
		}
	}

	/* Success */
	return (true);
}